

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::VerifyAliveWithHostContext
          (ScriptContext *this,BOOL isJSFunction,HostScriptContext *requestHostScriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContext *requestScriptContext;
  ThreadContext *this_00;
  HostScriptContext *pHVar4;
  undefined4 *puVar5;
  HostScriptContext *requestHostScriptContext_local;
  BOOL isJSFunction_local;
  ScriptContext *this_local;
  
  if (requestHostScriptContext == (HostScriptContext *)0x0) {
    this_00 = GetThreadContext(this);
    bVar2 = ThreadContext::IsJSRT(this_00);
    if (!bVar2) {
      pHVar4 = GetHostScriptContext(this);
      iVar3 = (*pHVar4->_vptr_HostScriptContext[10])();
      if (iVar3 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x640,
                                    "(GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller())"
                                    ,
                                    "GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    VerifyAlive(this,isJSFunction,(ScriptContext *)0x0);
  }
  else {
    requestScriptContext = HostScriptContext::GetScriptContext(requestHostScriptContext);
    VerifyAlive(this,isJSFunction,requestScriptContext);
  }
  return;
}

Assistant:

void ScriptContext::VerifyAliveWithHostContext(BOOL isJSFunction, HostScriptContext* requestHostScriptContext)
    {
        if (requestHostScriptContext)
        {
            VerifyAlive(isJSFunction, requestHostScriptContext->GetScriptContext());
        }
        else
        {
            Assert(GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller());
            VerifyAlive(isJSFunction, NULL);
        }
    }